

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O2

void __thiscall ON_SectionStyle::SetHatchIndex(ON_SectionStyle *this,int index)

{
  ON_SectionStylePrivate *pOVar1;
  ON_SectionStylePrivate *this_00;
  
  this_00 = this->m_private;
  pOVar1 = &DefaultSectionStylePrivate;
  if (this_00 != (ON_SectionStylePrivate *)0x0) {
    pOVar1 = this_00;
  }
  if (pOVar1->m_hatch_index != index) {
    if (this_00 == (ON_SectionStylePrivate *)0x0) {
      this_00 = (ON_SectionStylePrivate *)operator_new(0x50);
      this_00->m_background_fill_mode = None;
      this_00->m_fill_rule = ClosedCurves;
      *(undefined2 *)&this_00->field_0x2 = 0;
      this_00->m_hatch_index = 0;
      this_00->m_hatch_scale = 0.0;
      this_00->m_hatch_rotation = 0.0;
      this_00->m_background_fill_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_background_fill_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_boundary_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_boundary_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_hatch_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      this_00->m_hatch_print_color = (anon_union_4_2_6147a14e_for_ON_Color_15)0x0;
      *(undefined8 *)&this_00->m_boundary_visible = 0;
      this_00->m_boundary_width_scale = 0.0;
      (this_00->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)0x0;
      (this_00->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      ON_SectionStylePrivate::ON_SectionStylePrivate(this_00);
      this->m_private = this_00;
    }
    this_00->m_hatch_index = index;
  }
  return;
}

Assistant:

int ON_SectionStyle::HatchIndex() const
{
  return m_private ? m_private->m_hatch_index : DefaultSectionStylePrivate.m_hatch_index;
}